

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

void check_start_used_ptr(compiler_common *common)

{
  sljit_compiler *compiler;
  sljit_jump *jump;
  sljit_label *label;
  sljit_sw src1w;
  sljit_s32 src1;
  
  compiler = common->compiler;
  if (common->mode == 4) {
    src1w = (sljit_sw)common->start_used_ptr;
    src1 = 0x8e;
  }
  else {
    if (common->mode != 2) {
      return;
    }
    src1 = 1;
    sljit_emit_op2(compiler,0x60,1,0,0x8e,(long)common->start_used_ptr,0x40,1);
    src1w = 0;
  }
  jump = sljit_emit_cmp(compiler,5,src1,src1w,2,0);
  sljit_emit_op1(compiler,0x20,0x8e,(long)common->start_used_ptr,2,0);
  label = sljit_emit_label(compiler);
  sljit_set_label(jump,label);
  return;
}

Assistant:

static SLJIT_INLINE void check_start_used_ptr(compiler_common *common)
{
/* May destroy TMP1. */
DEFINE_COMPILER;
struct sljit_jump *jump;

if (common->mode == PCRE2_JIT_PARTIAL_SOFT)
  {
  /* The value of -1 must be kept for start_used_ptr! */
  OP2(SLJIT_ADD, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->start_used_ptr, SLJIT_IMM, 1);
  /* Jumps if start_used_ptr < STR_PTR, or start_used_ptr == -1. Although overwriting
  is not necessary if start_used_ptr == STR_PTR, it does not hurt as well. */
  jump = CMP(SLJIT_LESS_EQUAL, TMP1, 0, STR_PTR, 0);
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->start_used_ptr, STR_PTR, 0);
  JUMPHERE(jump);
  }
else if (common->mode == PCRE2_JIT_PARTIAL_HARD)
  {
  jump = CMP(SLJIT_LESS_EQUAL, SLJIT_MEM1(SLJIT_SP), common->start_used_ptr, STR_PTR, 0);
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->start_used_ptr, STR_PTR, 0);
  JUMPHERE(jump);
  }
}